

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O0

int dlposix_memalign(void **pp,size_t alignment,size_t bytes)

{
  ulong uVar1;
  size_t r;
  size_t d;
  void *mem;
  size_t bytes_local;
  size_t alignment_local;
  void **pp_local;
  
  d = 0;
  if (alignment == 0x10) {
    d = (size_t)dlmalloc(bytes);
  }
  else {
    uVar1 = alignment >> 3;
    if ((((alignment & 7) != 0) || (uVar1 == 0)) || ((uVar1 & uVar1 - 1) != 0)) {
      return 0x16;
    }
    if (bytes <= -alignment - 0x80) {
      bytes_local = alignment;
      if (alignment < 0x20) {
        bytes_local = 0x20;
      }
      d = (size_t)internal_memalign(&_gm_,bytes_local,bytes);
    }
  }
  if (d == 0) {
    pp_local._4_4_ = 0xc;
  }
  else {
    *pp = (void *)d;
    pp_local._4_4_ = 0;
  }
  return pp_local._4_4_;
}

Assistant:

int dlposix_memalign(void** pp, size_t alignment, size_t bytes) {
  void* mem = 0;
  if (alignment == MALLOC_ALIGNMENT)
    mem = dlmalloc(bytes);
  else {
    size_t d = alignment / sizeof(void*);
    size_t r = alignment % sizeof(void*);
    if (r != 0 || d == 0 || (d & (d-SIZE_T_ONE)) != 0)
      return EINVAL;
    else if (bytes <= MAX_REQUEST - alignment) {
      if (alignment <  MIN_CHUNK_SIZE)
        alignment = MIN_CHUNK_SIZE;
      mem = internal_memalign(gm, alignment, bytes);
    }
  }
  if (mem == 0)
    return ENOMEM;
  else {
    *pp = mem;
    return 0;
  }
}